

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
ClearAllocators(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *this)

{
  code *pcVar1;
  bool bVar2;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>> *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  FreeObject *this_02;
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_03;
  
  this_03 = &this->allocatorHead;
  do {
    SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::Clear(this_03);
    this_03 = this_03->next;
  } while (this_03 != &this->allocatorHead);
  this_02 = this->explicitFreeList;
  if (this_02 != (FreeObject *)0x0) {
    this_00 = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
               *)__tls_get_addr(&PTR_01548f08);
    do {
      if ((this_02 < (FreeObject *)0x10000) || (((ulong)this_02 & 0xf) != 0)) {
LAB_006cdf8c:
        HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::
        ClearAllocators(this_00);
LAB_006cdf94:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_01 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                HeapBlockMap64::GetHeapBlock
                          (&((this->super_HeapBucket).heapInfo)->recycler->heapBlockMap,this_02);
      if (this_01 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) goto LAB_006cdf8c;
      if ((this_01->super_HeapBlock).heapBlockType == LargeBlockType) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)this_00 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x10a,"(!heapBlock->IsLargeHeapBlock())",
                           "!heapBlock->IsLargeHeapBlock()");
        if (!bVar2) goto LAB_006cdf94;
        *(undefined4 *)this_00 = 0;
      }
      SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                (this_01,this_02);
      this_02 = FreeObject::GetNext(this_02);
    } while (this_02 != (FreeObject *)0x0);
  }
  this->explicitFreeList = (FreeObject *)0x0;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::ClearAllocators()
{
    ForEachAllocator([](TBlockAllocatorType * allocator) { ClearAllocator(allocator); });

#ifdef RECYCLER_PAGE_HEAP

#endif

#ifdef RECYCLER_MEMORY_VERIFY
    FreeObject* freeObject = this->explicitFreeList;

    while (freeObject)
    {
        HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock((void*)freeObject);
        Assert(heapBlock != nullptr);
        Assert(!heapBlock->IsLargeHeapBlock());
        TBlockType* smallBlock = (TBlockType*)heapBlock;

        smallBlock->ClearExplicitFreeBitForObject((void*)freeObject);
        freeObject = freeObject->GetNext();
    }
#endif

    this->explicitFreeList = nullptr;
}